

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.hpp
# Opt level: O2

basic_endpoint<boost::asio::ip::udp> * __thiscall
libtorrent::detail::
read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char_const*&>
          (basic_endpoint<boost::asio::ip::udp> *__return_storage_ptr__,detail *this,char **in)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 *puVar3;
  address addr;
  address aStack_38;
  
  read_v4_address<char_const*&>(&aStack_38,this,in);
  puVar3 = *(undefined1 **)this;
  uVar1 = *puVar3;
  *(undefined1 **)this = puVar3 + 1;
  uVar2 = puVar3[1];
  *(undefined1 **)this = puVar3 + 2;
  boost::asio::ip::detail::endpoint::endpoint
            (&__return_storage_ptr__->impl_,&aStack_38,CONCAT11(uVar1,uVar2));
  return __return_storage_ptr__;
}

Assistant:

Endpoint read_v4_endpoint(InIt&& in)
		{
			address addr = read_v4_address(in);
			std::uint16_t port = read_uint16(in);
			return Endpoint(addr, port);
		}